

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketServer.h
# Opt level: O0

int __thiscall asl::SocketServer::bind(SocketServer *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  int iVar1;
  undefined8 extraout_RAX;
  String local_30;
  uint local_14;
  SocketServer *pSStack_10;
  int port_local;
  SocketServer *this_local;
  
  local_14 = __fd;
  pSStack_10 = this;
  asl::String::String(&local_30,"0.0.0.0");
  iVar1 = bind(this,(int)&local_30,(sockaddr *)(ulong)local_14,__len);
  asl::String::~String(&local_30);
  return (uint)CONCAT71((int7)((ulong)extraout_RAX >> 8),(char)iVar1) & 0xffffff01;
}

Assistant:

bool bind(int port) { return bind("0.0.0.0", port); }